

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementHexaANCF_3843 *this)

{
  double *pdVar1;
  double *s;
  double *s_00;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar41;
  double *pdVar42;
  Matrix<double,_32,_3,_0,_32,_3> *pMVar43;
  long lVar44;
  double *pdVar45;
  MatrixNx3c *pMVar46;
  double dVar47;
  ActualDstType actualDst_3;
  long lVar48;
  Matrix3xN *a_lhs;
  ulong uVar49;
  ChElementHexaANCF_3843 *this_01;
  uint f;
  ActualDstType actualDst;
  double *pdVar50;
  long lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ActualDstType actualDst_2;
  ActualDstType actualDst_1;
  ChMatrix33<double> J_0xi;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_3,_3> D33;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  DstEvaluatorType dstEvaluator;
  MatrixNx3c Sxi_D_0xi;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNxN scale;
  double *local_4bc0;
  add_assign_op<double,_double> local_4ba9;
  double *local_4ba8;
  double *local_4ba0;
  undefined8 uStack_4b98;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b88;
  ChElementHexaANCF_3843 *local_4b80;
  double *local_4b78;
  double *local_4b70;
  double *local_4b68;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b60;
  Matrix3xN *local_4b58;
  ulong local_4b50;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b48;
  undefined1 local_4b40 [24];
  XprTypeNested local_4b28;
  variable_if_dynamic<long,__1> local_4b20;
  variable_if_dynamic<long,__1> local_4b18;
  Index local_4b10;
  Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> local_4b08;
  undefined1 local_4b00 [88];
  Scalar *local_4aa8;
  add_assign_op<double,_double> *local_4aa0;
  undefined1 *local_4a98;
  Scalar local_4a90;
  double local_4a88;
  undefined1 *local_4a78;
  Matrix<double,_3,_3,_1,_3,_3> local_4a70;
  Matrix<double,_3,_3,_1,_3,_3> local_4a28;
  Matrix<double,_3,_3,_1,_3,_3> local_49e0;
  DstEvaluatorType local_4998;
  undefined1 local_4980 [64];
  Matrix<double,_32,_3,_0,_32,_3> local_4940;
  undefined1 local_4640 [16];
  scalar_constant_op<double> local_4630;
  variable_if_dynamic<long,__1> local_4628;
  Matrix<double,_32,_3,_0,_32,_3> *local_4620;
  Matrix<double,_3,_3,_1,_3,_3> *local_4618;
  RhsNested local_4610;
  Matrix<double,_32,_3,_0,_32,_3> *local_4608;
  Matrix<double,_3,_3,_1,_3,_3> *local_4600;
  RhsNested local_45f8;
  MatrixNx3c *local_45f0;
  LhsNested local_45e8;
  RhsNested local_45e0;
  RhsNested local_45d8;
  MatrixNx3c local_2640;
  undefined1 local_2308 [648];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_2080;
  undefined8 auStack_2060 [1030];
  
  local_4b88 = &this->m_O1;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b88,0x100000,0x400,0x400);
  local_4b48 = &this->m_O2;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b48,0x100000,0x400,0x400);
  local_4b60 = &this->m_K3Compact;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b60,0x400,0x20,0x20);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact,0x400,0x20,0x20);
  local_4640._0_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows;
  local_4640._8_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_cols;
  local_4630.m_other = 0.0;
  if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->m_K13Compact,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
    local_4640._0_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows;
    local_4640._8_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols;
    local_4630.m_other = 0.0;
    if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_4b60,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
      local_4640._0_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_4640._8_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_4630.m_other = 0.0;
      if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (local_4b88,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
        peVar7 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        this_00 = (this->m_material).
                  super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_4b80 = this;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = (peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array[0];
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x30);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x60);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xc0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xc0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x90);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x90);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 8);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x38);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x68);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf8);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf8);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 200);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 200);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x98);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x98);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x10);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x40);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x70);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x100);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x100);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xd0);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xd0);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xa0);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar7->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xa0);
        local_4640._0_8_ = local_2308;
        local_4640._8_8_ = 0;
        local_4630.m_other = 4.94065645841247e-324;
        local_4628.m_value = 1;
        local_2308._0_8_ =
             (peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
             m_data.array[0];
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x28);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_4640,
                             pdVar42);
        pdVar50 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x20);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 8));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x18);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x10));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0xf0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pdVar50 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x118);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pdVar45 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x110);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        local_4ba8 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xf8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba8);
        pdVar1 = (double *)
                 ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0x108);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        local_4980._0_8_ =
             (long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0x100;
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(Scalar *)local_4980._0_8_);
        local_4b68 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xc0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b68);
        s = (double *)
            ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0xe8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s);
        local_4ba0 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xe0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s);
        local_4b70 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 200);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b70);
        s_00 = (double *)
               ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array + 0xd8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s_00);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s_00);
        local_4b78 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xd0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b78);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(Scalar *)local_4980._0_8_);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x30));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x58);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pdVar50 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x38));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x48);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x40));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x90);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pdVar50 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0xb8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pdVar45 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0xb0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        local_4ba8 = (double *)
                     ((long)(peVar7->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0x98);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba8);
        pdVar1 = (double *)
                 ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0xa8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        local_4980._0_8_ =
             (long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0xa0;
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(Scalar *)local_4980._0_8_);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b68);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b70);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s_00);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba0);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,s_00);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4b78);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,local_4ba8);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar45);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar1);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(Scalar *)local_4980._0_8_);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x60));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x88);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pdVar50 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x80);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,(double *)
                                     ((long)(peVar7->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x68));
        pdVar42 = (double *)
                  ((long)(peVar7->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x78);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar50);
        pCVar41 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar41,pdVar42);
        Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                  (pCVar41,(double *)
                           ((long)(peVar7->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x70));
        if ((local_4628.m_value + local_4640._8_8_ != 9) ||
           ((Matrix<double,__1,__1,_0,__1,__1> *)local_4630.m_other !=
            (Matrix<double,__1,__1,_0,__1,__1> *)0x9)) {
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 9, 9, 1>>::finished() [MatrixType = Eigen::Matrix<double, 9, 9, 1>]"
                       );
        }
        this_01 = local_4b80;
        if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
          a_lhs = &local_4b80->m_ebar0;
          uVar49 = 0;
          local_4b58 = a_lhs;
          do {
            if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
              pdVar42 = (double *)0x0;
              local_4b50 = uVar49;
              do {
                lVar44 = *(long *)(DAT_00b92c40 + 0x48);
                if (*(long *)(DAT_00b92c40 + 0x50) != lVar44) {
                  pdVar50 = (double *)0x0;
                  local_4b78 = pdVar42;
                  do {
                    lVar48 = *(long *)(static_tables_3843 + 0x48);
                    local_4ba0 = *(double **)(lVar48 + uVar49 * 8);
                    dVar47 = *(double *)(lVar48 + (long)local_4b78 * 8);
                    dVar2 = *(double *)(lVar48 + (long)pdVar50 * 8);
                    local_4b70 = pdVar50;
                    Calc_Sxi_D(this_01,&local_2640,*(double *)(lVar44 + uVar49 * 8),
                               *(double *)(lVar44 + (long)local_4b78 * 8),
                               *(double *)(lVar44 + (long)pdVar50 * 8));
                    local_4b00._0_8_ = 0.0;
                    local_4b00._8_8_ = 0.0;
                    local_4b00._16_8_ = 0.0;
                    local_4b00._24_8_ = 0.0;
                    local_4b00._32_8_ = 0.0;
                    local_4b00._40_8_ = 0.0;
                    local_4b00._48_8_ = 0.0;
                    local_4b00._56_8_ = 0.0;
                    local_4b00._64_8_ = 0.0;
                    local_4640._0_8_ = 0x3ff0000000000000;
                    Eigen::internal::
                    generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                    ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                              ((Matrix<double,_3,_3,_1,_3,_3> *)local_4b00,a_lhs,&local_2640,
                               (Scalar *)local_4640);
                    local_4640._0_8_ = &local_2640;
                    local_2080.m_dst = (DstEvaluatorType *)&local_2640;
                    local_2080.m_src = (SrcEvaluatorType *)local_4b00;
                    Eigen::internal::
                    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                    ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_4640 + 8),
                          (SrcXprType *)&local_2080.m_src,(assign_op<double,_double> *)local_4b40);
                    uVar10 = local_4640._0_8_;
                    local_45f0 = (MatrixNx3c *)local_4640._0_8_;
                    local_45e8 = (LhsNested)(local_4640 + 8);
                    local_45e0 = (RhsNested)0x3;
                    lVar44 = 7;
                    pdVar42 = local_4940.
                              super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                              m_storage.m_data.array + 0x18;
                    do {
                      auVar52._8_8_ = 0;
                      auVar52._0_8_ = *(ulong *)(local_4640 + lVar44 * 8 + -0x30);
                      auVar53 = vbroadcastsd_avx512f(auVar52);
                      auVar54 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])uVar10);
                      auVar3._8_8_ = 0;
                      auVar3._0_8_ = *(ulong *)(local_4640 + lVar44 * 8 + -0x18);
                      auVar55 = vbroadcastsd_avx512f(auVar3);
                      auVar4._8_8_ = 0;
                      auVar4._0_8_ = *(ulong *)(local_4640 + lVar44 * 8);
                      auVar56 = vbroadcastsd_avx512f(auVar4);
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar55,
                                                    *(undefined1 (*) [64])(uVar10 + 0x100));
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar56,
                                                    *(undefined1 (*) [64])(uVar10 + 0x200));
                      *(undefined1 (*) [64])
                       ((plain_array<double,_96,_0,_64> *)(pdVar42 + -0x18))->array = auVar54;
                      auVar54 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(uVar10 + 0x40));
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar55,
                                                    *(undefined1 (*) [64])(uVar10 + 0x140));
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar56,
                                                    *(undefined1 (*) [64])(uVar10 + 0x240));
                      *(undefined1 (*) [64])(pdVar42 + -0x10) = auVar54;
                      auVar54 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(uVar10 + 0x80));
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar55,
                                                    *(undefined1 (*) [64])(uVar10 + 0x180));
                      auVar54 = vfmadd231pd_avx512f(auVar54,auVar56,
                                                    *(undefined1 (*) [64])(uVar10 + 0x280));
                      *(undefined1 (*) [64])(pdVar42 + -8) = auVar54;
                      auVar53 = vmulpd_avx512f(auVar53,*(undefined1 (*) [64])(uVar10 + 0xc0));
                      auVar53 = vfmadd231pd_avx512f(auVar53,auVar55,
                                                    *(undefined1 (*) [64])(uVar10 + 0x1c0));
                      auVar53 = vfmadd231pd_avx512f(auVar53,auVar56,
                                                    *(undefined1 (*) [64])(uVar10 + 0x2c0));
                      *(undefined1 (*) [64])pdVar42 = auVar53;
                      lVar44 = lVar44 + 1;
                      pdVar42 = pdVar42 + 0x20;
                    } while (lVar44 != 10);
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = local_4b00._24_8_;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = local_4b00._32_8_;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = local_4b00._64_8_;
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = local_4b00._56_8_;
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = (double)local_4b00._56_8_ * (double)local_4b00._40_8_;
                    auVar52 = vfmsub231sd_fma(auVar66,auVar61,auVar63);
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = (double)local_4b00._48_8_ * (double)local_4b00._40_8_;
                    auVar3 = vfmsub231sd_fma(auVar64,auVar59,auVar63);
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = (double)local_4b00._48_8_ * (double)local_4b00._32_8_;
                    auVar4 = vfmsub231sd_fma(auVar62,auVar59,auVar65);
                    auVar9._8_8_ = 0x8000000000000000;
                    auVar9._0_8_ = 0x8000000000000000;
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ =
                         auVar4._0_8_ * (double)local_4b00._16_8_ +
                         (auVar52._0_8_ * (double)local_4b00._0_8_ -
                         auVar3._0_8_ * (double)local_4b00._8_8_);
                    auVar52 = vxorpd_avx512vl(auVar60,auVar9);
                    local_4ba0 = (double *)(dVar47 * (double)local_4ba0 * dVar2 * auVar52._0_8_);
                    uStack_4b98 = 0;
                    local_4630.m_other = (double)local_4ba0 * 0.5;
                    local_4bc0 = (double *)&local_4940;
                    local_4618 = &local_49e0;
                    local_4600 = &local_4a28;
                    local_45e0 = &local_4a70;
                    local_4620 = (Matrix<double,_32,_3,_0,_32,_3> *)local_4bc0;
                    local_4610.m_matrix = (non_const_type)local_4bc0;
                    local_4608 = (Matrix<double,_32,_3,_0,_32,_3> *)local_4bc0;
                    local_45f8.m_matrix = (non_const_type)local_4bc0;
                    local_45e8 = (LhsNested)local_4bc0;
                    local_45d8.m_matrix = (non_const_type)local_4bc0;
                    Eigen::internal::
                    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,32,1,32,32>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                              (local_4b60,
                               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>_>
                                *)local_4640,(add_assign_op<double,_double> *)(local_2308 + 0x288));
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = local_4ba0;
                    local_4980 = vbroadcastsd_avx512f(auVar5);
                    pdVar42 = (double *)0x0;
                    do {
                      local_4ba8 = (double *)(local_2308 + (long)pdVar42 * 0xd8);
                      pdVar50 = (double *)0x0;
                      local_4b68 = pdVar42;
                      do {
                        local_4b18.m_value = (long)pdVar50 * 3;
                        local_4b40._8_8_ = local_4ba8 + (long)pdVar50 * 3;
                        local_4b40._0_8_ = &local_4940;
                        local_4b28 = (XprTypeNested)local_2308;
                        local_4b10 = 9;
                        local_4b20.m_value = (long)pdVar42 * 3;
                        local_4b08.m_matrix = (non_const_type)local_4b40._0_8_;
                        memset((Matrix<double,_32,_32,_1,_32,_32> *)local_4640,0,0x2000);
                        local_4a90 = 1.0;
                        Eigen::internal::
                        generic_product_impl<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                        ::scaleAndAddTo<Eigen::Matrix<double,32,32,1,32,32>>
                                  ((Matrix<double,_32,_32,_1,_32,_32> *)local_4640,
                                   (Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                                    *)local_4b40,&local_4b08,&local_4a90);
                        lVar44 = 0xc0;
                        do {
                          uVar10 = *(undefined8 *)(local_4640 + lVar44 + -0xb8);
                          uVar11 = *(undefined8 *)(local_4640 + lVar44 + -0xb0);
                          uVar12 = *(undefined8 *)(local_4640 + lVar44 + -0xa8);
                          uVar13 = *(undefined8 *)(local_4640 + lVar44 + -0xa0);
                          uVar14 = *(undefined8 *)(local_4640 + lVar44 + -0x98);
                          uVar15 = *(undefined8 *)(local_4640 + lVar44 + -0x90);
                          uVar16 = *(undefined8 *)(local_4640 + lVar44 + -0x88);
                          uVar17 = *(undefined8 *)(local_4640 + lVar44 + -0x80);
                          uVar18 = *(undefined8 *)(local_4640 + lVar44 + -0x78);
                          uVar19 = *(undefined8 *)(local_4640 + lVar44 + -0x70);
                          uVar20 = *(undefined8 *)(local_4640 + lVar44 + -0x68);
                          uVar21 = *(undefined8 *)(local_4640 + lVar44 + -0x60);
                          uVar22 = *(undefined8 *)(local_4640 + lVar44 + -0x58);
                          uVar23 = *(undefined8 *)(local_4640 + lVar44 + -0x50);
                          uVar24 = *(undefined8 *)(local_4640 + lVar44 + -0x48);
                          uVar25 = *(undefined8 *)(local_4640 + lVar44 + -0x40);
                          uVar26 = *(undefined8 *)(local_4640 + lVar44 + -0x38);
                          uVar27 = *(undefined8 *)(local_4640 + lVar44 + -0x30);
                          uVar28 = *(undefined8 *)(local_4640 + lVar44 + -0x28);
                          uVar29 = *(undefined8 *)(local_4640 + lVar44 + -0x20);
                          uVar30 = *(undefined8 *)(local_4640 + lVar44 + -0x18);
                          uVar31 = *(undefined8 *)(local_4640 + lVar44 + -0x10);
                          uVar32 = *(undefined8 *)(local_4640 + lVar44 + -8);
                          uVar33 = *(undefined8 *)(local_4640 + lVar44);
                          uVar34 = *(undefined8 *)(local_4640 + lVar44 + 8);
                          uVar35 = *(undefined8 *)((long)&local_4630.m_other + lVar44);
                          uVar36 = *(undefined8 *)((long)&local_4628.m_value + lVar44);
                          uVar37 = *(undefined8 *)((long)&local_4620 + lVar44);
                          uVar38 = *(undefined8 *)((long)&local_4618 + lVar44);
                          uVar39 = *(undefined8 *)((long)&local_4610.m_matrix + lVar44);
                          uVar40 = *(undefined8 *)((long)&local_4608 + lVar44);
                          *(undefined8 *)(local_2308 + lVar44 + 0x1c8) =
                               *(undefined8 *)(local_4640 + lVar44 + -0xc0);
                          *(undefined8 *)(local_2308 + lVar44 + 0x1d0) = uVar10;
                          *(undefined8 *)(local_2308 + lVar44 + 0x1d8) = uVar11;
                          *(undefined8 *)(local_2308 + lVar44 + 0x1e0) = uVar12;
                          *(undefined8 *)(local_2308 + lVar44 + 0x1e8) = uVar13;
                          *(undefined8 *)(local_2308 + lVar44 + 0x1f0) = uVar14;
                          *(undefined8 *)(local_2308 + lVar44 + 0x1f8) = uVar15;
                          *(undefined8 *)(local_2308 + lVar44 + 0x200) = uVar16;
                          *(undefined8 *)(local_2308 + lVar44 + 0x208) = uVar17;
                          *(undefined8 *)(local_2308 + lVar44 + 0x210) = uVar18;
                          *(undefined8 *)(local_2308 + lVar44 + 0x218) = uVar19;
                          *(undefined8 *)(local_2308 + lVar44 + 0x220) = uVar20;
                          *(undefined8 *)(local_2308 + lVar44 + 0x228) = uVar21;
                          *(undefined8 *)(local_2308 + lVar44 + 0x230) = uVar22;
                          *(undefined8 *)(local_2308 + lVar44 + 0x238) = uVar23;
                          *(undefined8 *)(local_2308 + lVar44 + 0x240) = uVar24;
                          *(undefined8 *)(local_2308 + lVar44 + 0x248) = uVar25;
                          *(undefined8 *)(local_2308 + lVar44 + 0x250) = uVar26;
                          *(undefined8 *)(local_2308 + lVar44 + 600) = uVar27;
                          *(undefined8 *)(local_2308 + lVar44 + 0x260) = uVar28;
                          *(undefined8 *)(local_2308 + lVar44 + 0x268) = uVar29;
                          *(undefined8 *)(local_2308 + lVar44 + 0x270) = uVar30;
                          *(undefined8 *)(local_2308 + lVar44 + 0x278) = uVar31;
                          *(undefined8 *)(local_2308 + lVar44 + 0x280) = uVar32;
                          *(undefined8 *)(local_2308 + lVar44 + 0x288) = uVar33;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + -0x18) = uVar34;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + -0x10) = uVar35;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + -8) = uVar36;
                          *(undefined8 *)((long)auStack_2060 + lVar44) = uVar37;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + 8) = uVar38;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + 0x10) = uVar39;
                          *(undefined8 *)((long)auStack_2060 + lVar44 + 0x18) = uVar40;
                          lVar44 = lVar44 + 0x100;
                        } while (lVar44 != 0x20c0);
                        lVar44 = 0xc0;
                        do {
                          auVar53 = vmulpd_avx512f(local_4980,
                                                   *(undefined1 (*) [64])
                                                    (local_2308 + lVar44 + 0x1c8));
                          *(undefined1 (*) [64])(local_2308 + lVar44 + 0x1c8) = auVar53;
                          auVar53 = vmulpd_avx512f(local_4980,
                                                   *(undefined1 (*) [64])
                                                    (local_2308 + lVar44 + 0x208));
                          *(undefined1 (*) [64])(local_2308 + lVar44 + 0x208) = auVar53;
                          auVar53 = vmulpd_avx512f(local_4980,
                                                   *(undefined1 (*) [64])
                                                    (local_2308 + lVar44 + 0x248));
                          *(undefined1 (*) [64])(local_2308 + lVar44 + 0x248) = auVar53;
                          auVar53 = vmulpd_avx512f(local_4980,
                                                   *(undefined1 (*) [64])
                                                    (local_2308 + lVar44 + 0x288));
                          *(undefined1 (*) [64])(local_2308 + lVar44 + 0x288) = auVar53;
                          lVar44 = lVar44 + 0x100;
                        } while (lVar44 != 0x20c0);
                        auVar53 = *(undefined1 (*) [64])
                                   (local_4940.
                                    super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                    m_storage.m_data.array + (long)pdVar50 * 0x20);
                        auVar54 = *(undefined1 (*) [64])
                                   (local_4940.
                                    super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                    m_storage.m_data.array + (long)pdVar50 * 0x20U + 8);
                        auVar55 = *(undefined1 (*) [64])
                                   (local_4940.
                                    super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                    m_storage.m_data.array + (long)pdVar50 * 0x20U + 0x10);
                        auVar56 = *(undefined1 (*) [64])
                                   (local_4640 + (long)pdVar50 * 0x100 + -0x240);
                        lVar44 = 0x18;
                        pdVar45 = local_4bc0;
                        do {
                          auVar6._8_8_ = 0;
                          auVar6._0_8_ = *pdVar45;
                          auVar57 = vbroadcastsd_avx512f(auVar6);
                          auVar58 = vmulpd_avx512f(auVar53,auVar57);
                          *(undefined1 (*) [64])(local_4640 + lVar44 * 8 + -0xc0) = auVar58;
                          auVar58 = vmulpd_avx512f(auVar57,auVar54);
                          *(undefined1 (*) [64])(local_4640 + lVar44 * 8 + -0x80) = auVar58;
                          auVar58 = vmulpd_avx512f(auVar57,auVar55);
                          *(undefined1 (*) [64])(local_4640 + lVar44 * 8 + -0x40) = auVar58;
                          auVar57 = vmulpd_avx512f(auVar57,auVar56);
                          *(undefined1 (*) [64])(local_4640 + lVar44 * 8) = auVar57;
                          lVar44 = lVar44 + 0x20;
                          pdVar45 = pdVar45 + 1;
                        } while (lVar44 != 0x418);
                        lVar44 = 0;
                        local_4ba0 = pdVar50;
                        do {
                          lVar51 = lVar44 * 0x20;
                          lVar48 = 0;
                          do {
                            local_4b28 = (XprTypeNested)(lVar48 * 0x20);
                            local_4b18.m_value =
                                 (local_4b80->m_O1).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_rows;
                            local_4b40._0_8_ =
                                 (local_4b80->m_O1).
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_data + lVar48 * 0x20 + local_4b18.m_value * lVar51;
                            local_4b40._16_8_ = local_4b88;
                            local_4b20.m_value = lVar51;
                            if ((local_4b18.m_value <
                                 (long)((local_4b28->
                                        super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>
                                        ).m_storage.m_data.array + 4)) ||
                               ((local_4b80->m_O1).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols < lVar51 + 0x20)) goto LAB_00719e12;
                            local_4a78 = local_4640;
                            local_4b00._80_8_ = &local_4998;
                            local_4aa8 = &local_4a90;
                            local_4aa0 = &local_4ba9;
                            local_4a98 = local_4b40;
                            local_4a88 = *(double *)
                                          (local_2308 + lVar44 * 8 + lVar48 * 0x100 + 0x288);
                            local_4998.
                            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false,_true>
                            .
                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>,_Eigen::Matrix<double,_32,_32,_0,_32,_32>_>
                            .m_data = (PointerType)local_4b40._0_8_;
                            local_4998.
                            super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false,_true>
                            .
                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>,_Eigen::Matrix<double,_32,_32,_0,_32,_32>_>
                            .m_outerStride.m_value = local_4b18.m_value;
                            Eigen::internal::
                            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_0,_1>
                            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                                   *)(local_4b00 + 0x50));
                            lVar48 = lVar48 + 1;
                          } while (lVar48 != 0x20);
                          lVar44 = lVar44 + 1;
                        } while (lVar44 != 0x20);
                        pdVar50 = (double *)((long)local_4ba0 + 1);
                      } while (pdVar50 != (double *)0x3);
                      pdVar42 = (double *)((long)local_4b68 + 1);
                      local_4bc0 = local_4bc0 + 0x20;
                    } while (pdVar42 != (double *)0x3);
                    pdVar50 = (double *)(ulong)((int)local_4b70 + 1);
                    lVar44 = *(long *)(DAT_00b92c40 + 0x48);
                    a_lhs = local_4b58;
                    uVar49 = local_4b50;
                    this_01 = local_4b80;
                    pdVar42 = local_4b78;
                  } while (pdVar50 < (undefined1 *)(*(long *)(DAT_00b92c40 + 0x50) - lVar44 >> 3));
                }
                pdVar42 = (double *)(ulong)((int)pdVar42 + 1);
              } while (pdVar42 < (undefined1 *)
                                 (*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48) >>
                                 3));
            }
            uVar49 = (ulong)((int)uVar49 + 1);
          } while (uVar49 < (ulong)(*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48)
                                   >> 3));
        }
        lVar44 = 0;
        local_4b88 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
        do {
          pMVar43 = (Matrix<double,_32,_3,_0,_32,_3> *)((long)local_4b88 * 0x20);
          pdVar42 = (pMVar43->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                    m_storage.m_data.array + 4;
          lVar48 = 0;
          dVar47 = 0.0;
          do {
            dVar8 = (double)(this_01->m_O1).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
            dVar2 = (double)((long)dVar47 + 0x20);
            if (((long)dVar8 < (long)dVar2) ||
               ((this_01->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < (long)pdVar42)) {
LAB_00719e12:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 32, InnerPanel = false]"
                           );
            }
            pdVar50 = (this_01->m_O2).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            local_4618 = (Matrix<double,_3,_3,_1,_3,_3> *)
                         (this_01->m_O2).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows;
            local_4640._0_8_ = (long)pdVar50 + lVar48 + lVar44 * (long)local_4618;
            local_4630.m_other = (double)local_4b48;
            local_4628.m_value = (long)dVar47;
            local_4620 = pMVar43;
            if (((long)local_4618 < (long)dVar2) ||
               ((this_01->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < (long)pdVar42)) goto LAB_00719e12;
            pMVar46 = (MatrixNx3c *)
                      ((long)(this_01->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar48 + lVar44 * (long)dVar8);
            if ((pdVar50 != (double *)0x0) && ((MatrixNx3c *)local_4640._0_8_ == pMVar46)) {
              __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                            "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>, OtherDerived = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>>, MightHaveTransposeAliasing = true]"
                           );
            }
            local_2080.m_dst = (DstEvaluatorType *)&local_4940;
            local_2080.m_src = (SrcEvaluatorType *)&local_2640;
            local_2080.m_functor = (assign_op<double,_double> *)local_4b00;
            local_2080.m_dstExpr = (DstXprType *)local_4640;
            local_4940.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[0] = (double)local_4640._0_8_;
            local_4940.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[2] = (double)local_4618;
            local_2640.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[0] = (double)pMVar46;
            local_2640.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[2] = dVar8;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)(local_2308 + 0x288));
            lVar48 = lVar48 + 0x100;
            dVar47 = dVar2;
            this_01 = local_4b80;
          } while (dVar2 != 5.05923221341436e-321);
          local_4b88 = (Matrix<double,__1,__1,_0,__1,__1> *)
                       ((long)&(local_4b88->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                               m_storage.m_data + 1);
          lVar44 = lVar44 + 0x100;
          if (local_4b88 == (Matrix<double,__1,__1,_0,__1,__1> *)0x20) {
            return;
          }
        } while( true );
      }
    }
  }
  local_4630.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, PlainObjectType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                                Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}